

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::PeriodicDelaunay3dThread::get_lifted_vertex
          (PeriodicDelaunay3dThread *this,index_t v,double *result)

{
  bool bVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = (ulong)v;
  bVar1 = this->periodic_;
  if (bVar1 == true) {
    uVar4 = (ulong)(this->super_Periodic).nb_vertices_non_periodic_;
    uVar3 = v / uVar4;
    uVar4 = (ulong)v % uVar4;
  }
  else {
    uVar3 = 0;
  }
  pdVar2 = this->vertices_;
  dVar6 = pdVar2[(uint)((int)uVar4 * 3)];
  *result = dVar6;
  dVar5 = pdVar2[(int)uVar4 * 3 + 1];
  result[1] = dVar5;
  dVar7 = pdVar2[uVar4 * 3 + 2 & 0xffffffff];
  result[2] = dVar7;
  if (this->weights_ == (double *)0x0) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = this->weights_[uVar4];
  }
  result[3] = -dVar8;
  if (bVar1 != false) {
    dVar6 = dVar6 + (double)*(int *)(Periodic::translation + uVar3 * 0xc) * this->period_;
    *result = dVar6;
    dVar5 = dVar5 + (double)*(int *)(Periodic::translation + uVar3 * 0xc + 4) * this->period_;
    result[1] = dVar5;
    dVar7 = dVar7 + (double)*(int *)(Periodic::translation + uVar3 * 0xc + 8) * this->period_;
    result[2] = dVar7;
  }
  result[3] = (dVar7 * dVar7 + dVar5 * dVar5 + dVar6 * dVar6) - dVar8;
  return;
}

Assistant:

void get_lifted_vertex(index_t v, double* result) const {
	    index_t instance = 0;
	    if(periodic_) {
		instance = periodic_vertex_instance(v);
		v = periodic_vertex_real(v);
	    }
	    result[0] = vertices_[3*v];
	    result[1] = vertices_[3*v+1];
	    result[2] = vertices_[3*v+2];
	    result[3] = -non_periodic_weight(v);
	    if(periodic_) {
		result[0] += double(translation[instance][0]) * period_;
		result[1] += double(translation[instance][1]) * period_;
		result[2] += double(translation[instance][2]) * period_;
	    }
	    result[3] +=
		geo_sqr(result[0]) + geo_sqr(result[1]) + geo_sqr(result[2]);
	}